

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

void density_tests::detail::
     lf_queues_generic_tests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
               (TestSettings *i_settings,QueueTesterFlags i_flags,ostream *i_output,
               EasyRandom *i_random,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *i_nonblocking_thread_counts)

{
  size_t sVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  EasyRandom *pEVar3;
  QueueTesterFlags QVar4;
  bool bVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  byte local_32;
  byte local_31;
  bool run_page_256;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvStack_30;
  bool run_page_default;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *i_nonblocking_thread_counts_local;
  EasyRandom *i_random_local;
  ostream *i_output_local;
  TestSettings *pTStack_10;
  QueueTesterFlags i_flags_local;
  TestSettings *i_settings_local;
  
  pvStack_30 = i_nonblocking_thread_counts;
  i_nonblocking_thread_counts_local =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)i_random;
  i_random_local = (EasyRandom *)i_output;
  i_output_local._4_4_ = i_flags;
  pTStack_10 = i_settings;
  local_31 = TestSettings::should_run(i_settings,"page_def");
  local_32 = TestSettings::should_run(pTStack_10,"page_256");
  bVar5 = operator&&(i_output_local._4_4_,eUseTestAllocators);
  QVar4 = i_output_local._4_4_;
  pEVar3 = i_random_local;
  pvVar2 = i_nonblocking_thread_counts_local;
  if (bVar5) {
    if ((local_31 & 1) != 0) {
      sVar1 = pTStack_10->m_queue_tests_cardinality;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_50,pvStack_30);
      single_lf_queue_generic_test<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
                (QVar4,(ostream *)pEVar3,(EasyRandom *)pvVar2,sVar1,&local_50);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_50);
      QVar4 = i_output_local._4_4_;
      pEVar3 = i_random_local;
      pvVar2 = i_nonblocking_thread_counts_local;
      sVar1 = pTStack_10->m_queue_tests_cardinality;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_78,pvStack_30);
      single_lf_queue_generic_test<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
                (QVar4,(ostream *)pEVar3,(EasyRandom *)pvVar2,sVar1,&local_78);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_78);
    }
    QVar4 = i_output_local._4_4_;
    pEVar3 = i_random_local;
    pvVar2 = i_nonblocking_thread_counts_local;
    if ((local_32 & 1) != 0) {
      sVar1 = pTStack_10->m_queue_tests_cardinality;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_90,pvStack_30);
      single_lf_queue_generic_test<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
                (QVar4,(ostream *)pEVar3,(EasyRandom *)pvVar2,sVar1,&local_90);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_90);
      QVar4 = i_output_local._4_4_;
      pEVar3 = i_random_local;
      pvVar2 = i_nonblocking_thread_counts_local;
      sVar1 = pTStack_10->m_queue_tests_cardinality;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_a8,pvStack_30);
      single_lf_queue_generic_test<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
                (QVar4,(ostream *)pEVar3,(EasyRandom *)pvVar2,sVar1,&local_a8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_a8);
    }
  }
  else if ((local_31 & 1) != 0) {
    sVar1 = pTStack_10->m_queue_tests_cardinality;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c0,pvStack_30);
    single_lf_queue_generic_test<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)pvVar2,sVar1,&local_c0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_c0);
  }
  return;
}

Assistant:

void lf_queues_generic_tests(
          const TestSettings &        i_settings,
          QueueTesterFlags            i_flags,
          std::ostream &              i_output,
          EasyRandom &                i_random,
          std::vector<size_t> const & i_nonblocking_thread_counts)
        {
            using namespace density;

            bool const run_page_default = i_settings.should_run("page_def");
            bool const run_page_256     = i_settings.should_run("page_256");

            if (i_flags && QueueTesterFlags::eUseTestAllocators)
            {
                if (run_page_default)
                {
                    single_lf_queue_generic_test<lf_heter_queue<
                      runtime_type<>,
                      UnmovableFastTestAllocator<>,
                      PROD_CARDINALITY,
                      CONSUMER_CARDINALITY,
                      CONSISTENCY_MODEL>>(
                      i_flags,
                      i_output,
                      i_random,
                      i_settings.m_queue_tests_cardinality,
                      i_nonblocking_thread_counts);

                    single_lf_queue_generic_test<lf_heter_queue<
                      TestRuntimeTime<>,
                      DeepTestAllocator<>,
                      PROD_CARDINALITY,
                      CONSUMER_CARDINALITY,
                      CONSISTENCY_MODEL>>(
                      i_flags,
                      i_output,
                      i_random,
                      i_settings.m_queue_tests_cardinality,
                      i_nonblocking_thread_counts);
                }
                if (run_page_256)
                {
                    single_lf_queue_generic_test<lf_heter_queue<
                      runtime_type<>,
                      UnmovableFastTestAllocator<256>,
                      PROD_CARDINALITY,
                      CONSUMER_CARDINALITY,
                      CONSISTENCY_MODEL>>(
                      i_flags,
                      i_output,
                      i_random,
                      i_settings.m_queue_tests_cardinality,
                      i_nonblocking_thread_counts);

                    single_lf_queue_generic_test<lf_heter_queue<
                      TestRuntimeTime<>,
                      DeepTestAllocator<256>,
                      PROD_CARDINALITY,
                      CONSUMER_CARDINALITY,
                      CONSISTENCY_MODEL>>(
                      i_flags,
                      i_output,
                      i_random,
                      i_settings.m_queue_tests_cardinality,
                      i_nonblocking_thread_counts);
                }
            }
            else
            {
                if (run_page_default)
                {
                    single_lf_queue_generic_test<lf_heter_queue<
                      runtime_type<>,
                      default_allocator,
                      PROD_CARDINALITY,
                      CONSUMER_CARDINALITY,
                      CONSISTENCY_MODEL>>(
                      i_flags,
                      i_output,
                      i_random,
                      i_settings.m_queue_tests_cardinality,
                      i_nonblocking_thread_counts);
                }
            }
        }